

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.h
# Opt level: O1

uint64_t sum_quotients<unsigned_long,unsigned_long>
                   (random_numerators<unsigned_long> *vals,unsigned_long *div)

{
  uint64_t uVar1;
  long lVar2;
  
  if ((ulong)vals->_length == 0) {
    uVar1 = 0;
  }
  else {
    lVar2 = 0;
    uVar1 = 0;
    do {
      uVar1 = uVar1 + *(ulong *)((long)vals->_pData + lVar2) / *div;
      lVar2 = lVar2 + 8;
    } while ((ulong)vals->_length << 3 != lVar2);
  }
  return uVar1;
}

Assistant:

NOINLINE uint64_t sum_quotients(const random_numerators<IntT> &vals, const Divisor &div) {
    // Need to use unsigned to avoid signed integer overlow.
    typedef typename std::make_unsigned<IntT>::type UIntT;
    UIntT sum = 0;
    for (auto iter = vals.begin(); iter != vals.end(); ++iter) {
        sum += (UIntT)(*iter / div);
    }
    return (uint64_t)sum;
}